

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteSFixed64Array
               (int64 *a,int n,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteRaw(output,a,n * 8);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed64Array(const int64* a, int n,
                                        io::CodedOutputStream* output) {
  WriteArray<int64>(a, n, output);
}